

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O1

DependenceGraph * __thiscall dg::llvmdg::SDGBuilder::getOrCreateDG(SDGBuilder *this,Function *F)

{
  SystemDependenceGraph *pSVar1;
  DependenceGraph *pDVar2;
  long lVar3;
  mapped_type *ppDVar4;
  undefined1 auVar5 [16];
  Function *local_40;
  undefined8 local_38;
  Function local_30;
  undefined7 uStack_2f;
  
  pDVar2 = SystemDependenceGraph::getDG(this->_llvmsdg,F);
  if (pDVar2 == (DependenceGraph *)0x0) {
    pSVar1 = this->_llvmsdg;
    auVar5 = llvm::Value::getName();
    lVar3 = auVar5._0_8_;
    if (lVar3 == 0) {
      local_40 = &local_30;
      local_38 = 0;
      local_30 = (Function)0x0;
    }
    else {
      local_40 = &local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,lVar3,auVar5._8_8_ + lVar3);
    }
    pDVar2 = sdg::SystemDependenceGraph::createGraph((SystemDependenceGraph *)(pSVar1 + 0x28));
    std::__cxx11::string::_M_assign((string *)&pDVar2->_name);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
    local_40 = F;
    ppDVar4 = std::
              map<const_llvm::Function_*,_dg::sdg::DependenceGraph_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>_>_>
              ::operator[]((map<const_llvm::Function_*,_dg::sdg::DependenceGraph_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>_>_>
                            *)(this->_llvmsdg + 0xf0),&local_40);
    *ppDVar4 = pDVar2;
  }
  return pDVar2;
}

Assistant:

sdg::DependenceGraph &getOrCreateDG(llvm::Function *F) {
        auto *dg = _llvmsdg->getDG(F);
        if (!dg) {
            auto &g = _llvmsdg->getSDG().createGraph(F->getName().str());
            _llvmsdg->addFunMapping(F, &g);
            return g;
        }

        return *dg;
    }